

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O2

void arena_reset(tsd_t *tsd,arena_t *arena)

{
  rtree_ctx_t *rtree_ctx;
  pthread_mutex_t *ppVar1;
  ulong *puVar2;
  bin_t *bin;
  undefined8 *puVar3;
  undefined8 *puVar4;
  void *pvVar5;
  bin_t *pbVar6;
  undefined8 uVar7;
  extent_t *peVar8;
  rtree_leaf_elm_t *prVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  
  malloc_mutex_lock((tsdn_t *)tsd,&arena->large_mtx);
  ppVar1 = (pthread_mutex_t *)((long)&(arena->large_mtx).field_0 + 0x40);
  rtree_ctx = &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
  do {
    peVar8 = (arena->large).qlh_first;
    if (peVar8 == (extent_t *)0x0) {
      (arena->large_mtx).field_0.field_0.locked.repr = false;
      pthread_mutex_unlock(ppVar1);
      for (lVar12 = 0; lVar12 != 0x24; lVar12 = lVar12 + 1) {
        for (uVar11 = 0; uVar11 < bin_infos[lVar12].n_shards; uVar11 = uVar11 + 1) {
          pbVar6 = arena->bins[lVar12].bin_shards;
          bin = pbVar6 + uVar11;
          malloc_mutex_lock((tsdn_t *)tsd,&bin->lock);
          peVar8 = pbVar6[uVar11].slabcur;
          if (peVar8 != (extent_t *)0x0) {
            bin->slabcur = (extent_t *)0x0;
            (bin->lock).field_0.field_0.locked.repr = false;
            pthread_mutex_unlock((pthread_mutex_t *)((long)&(bin->lock).field_0 + 0x40));
            arena_slab_dalloc((tsdn_t *)tsd,arena,peVar8);
            malloc_mutex_lock((tsdn_t *)tsd,&bin->lock);
          }
          ppVar1 = (pthread_mutex_t *)((long)&(bin->lock).field_0 + 0x40);
          while (peVar8 = extent_heap_remove_first(&bin->slabs_nonfull), peVar8 != (extent_t *)0x0)
          {
            (bin->lock).field_0.field_0.locked.repr = false;
            pthread_mutex_unlock(ppVar1);
            arena_slab_dalloc((tsdn_t *)tsd,arena,peVar8);
            malloc_mutex_lock((tsdn_t *)tsd,&bin->lock);
          }
          while (peVar8 = (bin->slabs_full).qlh_first, peVar8 != (extent_t *)0x0) {
            arena_bin_slabs_full_remove(arena,bin,peVar8);
            (bin->lock).field_0.field_0.locked.repr = false;
            pthread_mutex_unlock(ppVar1);
            arena_slab_dalloc((tsdn_t *)tsd,arena,peVar8);
            malloc_mutex_lock((tsdn_t *)tsd,&bin->lock);
          }
          (bin->stats).curregs = 0;
          (bin->stats).curslabs = 0;
          (bin->lock).field_0.field_0.locked.repr = false;
          pthread_mutex_unlock(ppVar1);
        }
      }
      (arena->nactive).repr = 0;
      return;
    }
    pvVar5 = peVar8->e_addr;
    (arena->large_mtx).field_0.field_0.locked.repr = false;
    pthread_mutex_unlock(ppVar1);
    uVar10 = (ulong)pvVar5 & 0xffffffffc0000000;
    uVar11 = (ulong)(((uint)((ulong)pvVar5 >> 0x1e) & 0xf) << 4);
    puVar2 = (ulong *)((long)&rtree_ctx->cache[0].leafkey + uVar11);
    uVar11 = *(ulong *)((long)&rtree_ctx->cache[0].leafkey + uVar11);
    if (uVar11 != uVar10) {
      if ((tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx).l2_cache[0].leafkey
          == uVar10) {
        prVar9 = (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx).l2_cache[0].
                 leaf;
        (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx).l2_cache[0].leafkey =
             uVar11;
        (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx).l2_cache[0].leaf =
             (rtree_leaf_elm_t *)puVar2[1];
LAB_0010f328:
        *puVar2 = uVar10;
        puVar2[1] = (ulong)prVar9;
      }
      else {
        for (lVar12 = 0x148; lVar12 != 0x1b8; lVar12 = lVar12 + 0x10) {
          if (*(ulong *)((long)(tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx
                               ).cache + lVar12 + -0x38) == uVar10) {
            prVar9 = *(rtree_leaf_elm_t **)
                      ((long)((tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx)
                              .cache + -3) + lVar12);
            puVar3 = (undefined8 *)
                     ((long)(tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx).
                            cache + lVar12 + -0x48);
            uVar7 = puVar3[1];
            puVar4 = (undefined8 *)
                     ((long)(tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx).
                            cache + lVar12 + -0x38);
            *puVar4 = *puVar3;
            puVar4[1] = uVar7;
            *(ulong *)((long)(tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx).
                             cache + lVar12 + -0x48) = uVar11;
            *(ulong *)((long)((tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx)
                              .cache + -4) + lVar12) = puVar2[1];
            goto LAB_0010f328;
          }
        }
        rtree_leaf_elm_lookup_hard
                  ((tsdn_t *)tsd,&extents_rtree,rtree_ctx,(ulong)pvVar5 & 0xfffffffffffff000,true,
                   false);
      }
    }
    large_dalloc((tsdn_t *)tsd,peVar8);
    malloc_mutex_lock((tsdn_t *)tsd,&arena->large_mtx);
  } while( true );
}

Assistant:

void
arena_reset(tsd_t *tsd, arena_t *arena) {
	/*
	 * Locking in this function is unintuitive.  The caller guarantees that
	 * no concurrent operations are happening in this arena, but there are
	 * still reasons that some locking is necessary:
	 *
	 * - Some of the functions in the transitive closure of calls assume
	 *   appropriate locks are held, and in some cases these locks are
	 *   temporarily dropped to avoid lock order reversal or deadlock due to
	 *   reentry.
	 * - mallctl("epoch", ...) may concurrently refresh stats.  While
	 *   strictly speaking this is a "concurrent operation", disallowing
	 *   stats refreshes would impose an inconvenient burden.
	 */

	/* Large allocations. */
	malloc_mutex_lock(tsd_tsdn(tsd), &arena->large_mtx);

	for (extent_t *extent = extent_list_first(&arena->large); extent !=
	    NULL; extent = extent_list_first(&arena->large)) {
		void *ptr = extent_base_get(extent);
		size_t usize;

		malloc_mutex_unlock(tsd_tsdn(tsd), &arena->large_mtx);
		alloc_ctx_t alloc_ctx;
		rtree_ctx_t *rtree_ctx = tsd_rtree_ctx(tsd);
		rtree_szind_slab_read(tsd_tsdn(tsd), &extents_rtree, rtree_ctx,
		    (uintptr_t)ptr, true, &alloc_ctx.szind, &alloc_ctx.slab);
		assert(alloc_ctx.szind != SC_NSIZES);

		if (config_stats || (config_prof && opt_prof)) {
			usize = sz_index2size(alloc_ctx.szind);
			assert(usize == isalloc(tsd_tsdn(tsd), ptr));
		}
		/* Remove large allocation from prof sample set. */
		if (config_prof && opt_prof) {
			prof_free(tsd, ptr, usize, &alloc_ctx);
		}
		large_dalloc(tsd_tsdn(tsd), extent);
		malloc_mutex_lock(tsd_tsdn(tsd), &arena->large_mtx);
	}
	malloc_mutex_unlock(tsd_tsdn(tsd), &arena->large_mtx);

	/* Bins. */
	for (unsigned i = 0; i < SC_NBINS; i++) {
		for (unsigned j = 0; j < bin_infos[i].n_shards; j++) {
			arena_bin_reset(tsd, arena,
			    &arena->bins[i].bin_shards[j]);
		}
	}

	atomic_store_zu(&arena->nactive, 0, ATOMIC_RELAXED);
}